

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# User.h
# Opt level: O2

void __thiscall
User::User(User *this,int id,string *username,string *alias,string *bio,string *password)

{
  (this->username)._M_dataplus._M_p = (pointer)&(this->username).field_2;
  (this->username)._M_string_length = 0;
  (this->username).field_2._M_local_buf[0] = '\0';
  (this->alias)._M_dataplus._M_p = (pointer)&(this->alias).field_2;
  (this->alias)._M_string_length = 0;
  (this->alias).field_2._M_local_buf[0] = '\0';
  (this->bio)._M_dataplus._M_p = (pointer)&(this->bio).field_2;
  (this->bio)._M_string_length = 0;
  (this->bio).field_2._M_local_buf[0] = '\0';
  (this->password)._M_dataplus._M_p = (pointer)&(this->password).field_2;
  (this->password)._M_string_length = 0;
  (this->password).field_2._M_local_buf[0] = '\0';
  this->id = id;
  std::__cxx11::string::_M_assign((string *)&this->username);
  std::__cxx11::string::_M_assign((string *)&this->alias);
  std::__cxx11::string::_M_assign((string *)&this->bio);
  std::__cxx11::string::_M_assign((string *)&this->password);
  return;
}

Assistant:

User(int id, std::string username, std::string alias, std::string bio, std::string password)
  {
	  this->id = id;
	  this->username = username;
	  this->alias = alias;
	  this->bio = bio;
	  this->password = password;
  }